

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prod_tests1.cpp
# Opt level: O0

void __thiscall
test::iu_PeepTest_x_iutest_x_ScopedPeep_Test::Body(iu_PeepTest_x_iutest_x_ScopedPeep_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionHelper local_7c0;
  Fixed local_790;
  int local_604;
  undefined1 local_600 [8];
  AssertionResult iutest_ar_3;
  Fixed local_5a8;
  int local_420 [2];
  undefined1 local_418 [8];
  AssertionResult iutest_ar_2;
  Fixed local_3c0;
  int local_234;
  undefined1 local_230 [8];
  AssertionResult iutest_ar_1;
  Fixed local_1d8;
  int local_40 [2];
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_PeepTest_x_iutest_x_ScopedPeep_Test *this_local;
  
  *(undefined4 *)
   (prod_test::s_prod +
   iutest::detail::peep_tag<test::iu_peep_tag_m_z<test::prod_test::ProdClass>>::value) = 4;
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  local_40[1] = 4;
  local_40[0] = prod_test::ProdClass::GetZ((ProdClass *)prod_test::s_prod);
  iutest::internal::backward::EqHelper<false>::Compare<int>
            ((AssertionResult *)local_38,"4","prod_test::s_prod.GetZ()",local_40 + 1,local_40);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1d8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_38);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_1.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
               ,0x146,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_1.m_result,&local_1d8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_1.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  iutest::detail::AlwaysZero();
  local_234 = 4;
  iutest::internal::backward::EqHelper<false>::Compare<int>
            ((AssertionResult *)local_230,"4",
             "(prod_test::s_prod.*::iutest::detail::peep_tag< iu_peep_tag_m_z<prod_test::ProdClass> >::value)"
             ,&local_234,
             (int *)(prod_test::s_prod +
                    iutest::detail::peep_tag<test::iu_peep_tag_m_z<test::prod_test::ProdClass>>::
                    value));
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar1) {
    memset(&local_3c0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_3c0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_230);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_2.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
               ,0x148,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_2.m_result,&local_3c0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_2.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_3c0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  *(undefined4 *)
   (prod_test::s_prod +
   iutest::detail::peep_tag<test::iu_peep_tag_m_x<test::prod_test::ProdClass>>::value) = 4;
  iutest::detail::AlwaysZero();
  local_420[1] = 4;
  local_420[0] = prod_test::ProdClass::GetX((ProdClass *)prod_test::s_prod);
  iutest::internal::backward::EqHelper<false>::Compare<int>
            ((AssertionResult *)local_418,"4","prod_test::s_prod.GetX()",local_420 + 1,local_420);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
  if (!bVar1) {
    memset(&local_5a8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_5a8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_418);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_3.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
               ,0x14c,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_3.m_result,&local_5a8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_3.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_5a8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_418);
  iutest::detail::AlwaysZero();
  local_604 = 4;
  iutest::internal::backward::EqHelper<false>::Compare<int>
            ((AssertionResult *)local_600,"4",
             "(prod_test::s_prod.*::iutest::detail::peep_tag< iu_peep_tag_m_x<prod_test::ProdClass> >::value)"
             ,&local_604,
             (int *)(prod_test::s_prod +
                    iutest::detail::peep_tag<test::iu_peep_tag_m_x<test::prod_test::ProdClass>>::
                    value));
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_600);
  if (!bVar1) {
    memset(&local_790,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_790);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_600);
    iutest::AssertionHelper::AssertionHelper
              (&local_7c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
               ,0x14e,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_7c0,&local_790);
    iutest::AssertionHelper::~AssertionHelper(&local_7c0);
    iutest::AssertionHelper::Fixed::~Fixed(&local_790);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_600);
  return;
}

Assistant:

IUTEST(PeepTest, ScopedPeep)
{
    // マクロ版
    {
        IUTEST_PEEP_GET(prod_test::s_prod, prod_test::ProdClass, m_z) = 4;
        IUTEST_EXPECT_EQ(4, prod_test::s_prod.GetZ());

        IUTEST_EXPECT_EQ(4, IUTEST_PEEP_GET(prod_test::s_prod, prod_test::ProdClass, m_z));
    }
    {
        IUTEST_PEEP_GET(prod_test::s_prod, prod_test::ProdClass, m_x) = 4;
        IUTEST_EXPECT_EQ(4, prod_test::s_prod.GetX());

        IUTEST_EXPECT_EQ(4, IUTEST_PEEP_GET(prod_test::s_prod, prod_test::ProdClass, m_x));
    }
}